

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O0

char * __thiscall
FailableMemoryAllocator::alloc_memory
          (FailableMemoryAllocator *this,size_t size,char *file,size_t line)

{
  bool bVar1;
  char *pcVar2;
  LocationToFailAllocNode *in_RCX;
  undefined8 in_RSI;
  long *in_RDI;
  LocationToFailAllocNode *previous;
  LocationToFailAllocNode *current;
  size_t in_stack_ffffffffffffffb8;
  char *pcVar3;
  
  *(int *)(in_RDI + 6) = (int)in_RDI[6] + 1;
  pcVar2 = (char *)0x0;
  pcVar3 = (char *)in_RDI[5];
  while( true ) {
    if (pcVar3 == (char *)0x0) {
      pcVar2 = TestMemoryAllocator::alloc_memory
                         ((TestMemoryAllocator *)0x0,(size_t)pcVar2,(char *)in_RDI,
                          in_stack_ffffffffffffffb8);
      return pcVar2;
    }
    bVar1 = LocationToFailAllocNode::shouldFail
                      (in_RCX,(int)((ulong)pcVar3 >> 0x20),pcVar2,(size_t)in_RDI);
    if (bVar1) break;
    pcVar2 = pcVar3;
    pcVar3 = *(char **)(pcVar3 + 0x18);
  }
  if (pcVar2 == (char *)0x0) {
    in_RDI[5] = *(long *)(pcVar3 + 0x18);
  }
  else {
    *(undefined8 *)(pcVar2 + 0x18) = *(undefined8 *)(pcVar3 + 0x18);
  }
  (**(code **)(*in_RDI + 0x18))
            (in_RDI,pcVar3,in_RSI,
             "/workspace/llm4binary/github/license_c_cmakelists/bneumann[P]CppUTest-Test-Adapter/build_O0/_deps/cpputest-src/src/CppUTest/TestMemoryAllocator.cpp"
             ,0x166);
  return (char *)0x0;
}

Assistant:

char* FailableMemoryAllocator::alloc_memory(size_t size, const char* file, size_t line)
{
    currentAllocNumber_++;
    LocationToFailAllocNode* current = head_;
    LocationToFailAllocNode* previous = NULLPTR;

    while (current) {
      if (current->shouldFail(currentAllocNumber_, file, line)) {
        if (previous) previous->next_ = current->next_;
        else head_ = current->next_;

        free_memory((char*) current, size, __FILE__, __LINE__);
        return NULLPTR;
      }
      previous = current;
      current = current->next_;
    }
    return TestMemoryAllocator::alloc_memory(size, file, line);
}